

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.h
# Opt level: O0

void __thiscall CodeGenWorkItem::VerifyJitMode(CodeGenWorkItem *this)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  CodeGenWorkItem *this_local;
  
  EVar2 = GetJitMode(this);
  if ((EVar2 != SimpleJit) && (EVar2 = GetJitMode(this), EVar2 != FullJit)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                       ,0x9f,
                       "(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit)"
                       ,
                       "GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  EVar2 = GetJitMode(this);
  if (EVar2 == SimpleJit) {
    pFVar5 = GetFunctionBody(this);
    bVar3 = Js::FunctionBody::DoSimpleJit(pFVar5);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                         ,0xa0,
                         "(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit())"
                         ,
                         "GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit()"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  EVar2 = GetJitMode(this);
  if (EVar2 == FullJit) {
    pFVar5 = GetFunctionBody(this);
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    pFVar5 = GetFunctionBody(this);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FullJitPhase,sourceContextId,functionId);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.h"
                         ,0xa1,
                         "(GetJitMode() != ExecutionMode::FullJit || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::FullJitPhase)), ((GetFunctionBody())->GetSourceContextId()), ((GetFunctionBody())->GetLocalFunctionId())))"
                         ,
                         "GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody())"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void VerifyJitMode() const
    {
        Assert(GetJitMode() == ExecutionMode::SimpleJit || GetJitMode() == ExecutionMode::FullJit);
        Assert(GetJitMode() != ExecutionMode::SimpleJit || GetFunctionBody()->DoSimpleJit());
        Assert(GetJitMode() != ExecutionMode::FullJit || !PHASE_OFF(Js::FullJitPhase, GetFunctionBody()));
    }